

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blif_parser.cpp
# Opt level: O3

string * __thiscall Node::getProdecessor_abi_cxx11_(string *__return_storage_ptr__,Node *this)

{
  _Rb_tree_node_base *p_Var1;
  _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __first;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  _Any_data local_48;
  code *local_38;
  
  if ((this->_prodecessor)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"-","");
  }
  else {
    p_Var1 = (this->_prodecessor)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    __first._M_node = (_Base_ptr)std::_Rb_tree_increment(p_Var1);
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_68,*(long *)(p_Var1 + 1),
               (long)&(p_Var1[1]._M_parent)->_M_color + *(long *)(p_Var1 + 1));
    std::
    function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
    ::function((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                *)&local_48,&this->_joinFunction);
    std::
    accumulate<std::_Rb_tree_const_iterator<std::__cxx11::string>,std::__cxx11::string,std::function<std::__cxx11::string(std::__cxx11::string,std::__cxx11::string)>>
              (__return_storage_ptr__,__first,
               (_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                )&(this->_prodecessor)._M_t._M_impl.super__Rb_tree_header,&local_68,
               (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                *)&local_48);
    if (local_38 != (code *)0x0) {
      (*local_38)(&local_48,&local_48,__destroy_functor);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

string getProdecessor() {
    if (!this->_prodecessor.size()) {
      return "-";
    }

    return accumulate(next(this->_prodecessor.begin()), this->_prodecessor.end(), move(*this->_prodecessor.begin()), this->_joinFunction);
  }